

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

void __thiscall cmComputeLinkInformation::ComputeLinkTypeInfo(cmComputeLinkInformation *this)

{
  cmState *this_00;
  cmGeneratorTarget *this_01;
  bool bVar1;
  TargetType TVar2;
  cmValue cVar3;
  cmValue cVar4;
  allocator<char> local_61;
  char *target_type_str;
  string static_link_type_flag_var;
  cmValue lss;
  
  this_00 = (this->CMakeInstance->State)._M_t.
            super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
            super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
            super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&static_link_type_flag_var,"TARGET_ARCHIVES_MAY_BE_SHARED_LIBS",
             (allocator<char> *)&lss);
  bVar1 = cmState::GetGlobalPropertyAsBool(this_00,&static_link_type_flag_var);
  this->ArchivesMayBeShared = bVar1;
  std::__cxx11::string::~string((string *)&static_link_type_flag_var);
  this->LinkTypeEnabled = false;
  target_type_str = (char *)0x0;
  TVar2 = cmGeneratorTarget::GetType(this->Target);
  if (TVar2 == EXECUTABLE) {
    target_type_str = "EXE";
  }
  else if (TVar2 == SHARED_LIBRARY) {
    target_type_str = "SHARED_LIBRARY";
  }
  else {
    if (TVar2 != MODULE_LIBRARY) goto LAB_0046b9bb;
    target_type_str = "SHARED_MODULE";
  }
  cmStrCat<char_const(&)[7],char_const*&,char_const(&)[14],std::__cxx11::string&,char_const(&)[7]>
            (&static_link_type_flag_var,(char (*) [7])0x7a0538,&target_type_str,
             (char (*) [14])"_LINK_STATIC_",&this->LinkLanguage,(char (*) [7])0x789488);
  cVar3 = cmMakefile::GetDefinition(this->Makefile,&static_link_type_flag_var);
  cmStrCat<char_const(&)[7],char_const*&,char_const(&)[15],std::__cxx11::string&,char_const(&)[7]>
            ((string *)&lss,(char (*) [7])0x7a0538,&target_type_str,(char (*) [15])"_LINK_DYNAMIC_",
             &this->LinkLanguage,(char (*) [7])0x789488);
  cVar4 = cmMakefile::GetDefinition(this->Makefile,(string *)&lss);
  std::__cxx11::string::~string((string *)&lss);
  std::__cxx11::string::~string((string *)&static_link_type_flag_var);
  if (((cVar3.Value != (string *)0x0) &&
      (cVar4.Value != (string *)0x0 && (cVar3.Value)->_M_string_length != 0)) &&
     ((cVar4.Value)->_M_string_length != 0)) {
    this->LinkTypeEnabled = true;
    std::__cxx11::string::_M_assign((string *)&this->StaticLinkTypeFlag);
    std::__cxx11::string::_M_assign((string *)&this->SharedLinkTypeFlag);
  }
LAB_0046b9bb:
  this_01 = this->Target;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&static_link_type_flag_var,"LINK_SEARCH_START_STATIC",&local_61);
  lss = cmGeneratorTarget::GetProperty(this_01,&static_link_type_flag_var);
  std::__cxx11::string::~string((string *)&static_link_type_flag_var);
  bVar1 = cmValue::IsOn(&lss);
  this->StartLinkType = LinkShared - bVar1;
  this->CurrentLinkType = LinkShared - bVar1;
  return;
}

Assistant:

void cmComputeLinkInformation::ComputeLinkTypeInfo()
{
  // Check whether archives may actually be shared libraries.
  this->ArchivesMayBeShared =
    this->CMakeInstance->GetState()->GetGlobalPropertyAsBool(
      "TARGET_ARCHIVES_MAY_BE_SHARED_LIBS");

  // First assume we cannot do link type stuff.
  this->LinkTypeEnabled = false;

  // Lookup link type selection flags.
  cmValue static_link_type_flag = nullptr;
  cmValue shared_link_type_flag = nullptr;
  const char* target_type_str = nullptr;
  switch (this->Target->GetType()) {
    case cmStateEnums::EXECUTABLE:
      target_type_str = "EXE";
      break;
    case cmStateEnums::SHARED_LIBRARY:
      target_type_str = "SHARED_LIBRARY";
      break;
    case cmStateEnums::MODULE_LIBRARY:
      target_type_str = "SHARED_MODULE";
      break;
    default:
      break;
  }
  if (target_type_str) {
    std::string static_link_type_flag_var =
      cmStrCat("CMAKE_", target_type_str, "_LINK_STATIC_", this->LinkLanguage,
               "_FLAGS");
    static_link_type_flag =
      this->Makefile->GetDefinition(static_link_type_flag_var);

    std::string shared_link_type_flag_var =
      cmStrCat("CMAKE_", target_type_str, "_LINK_DYNAMIC_", this->LinkLanguage,
               "_FLAGS");
    shared_link_type_flag =
      this->Makefile->GetDefinition(shared_link_type_flag_var);
  }

  // We can support link type switching only if all needed flags are
  // known.
  if (cmNonempty(static_link_type_flag) && cmNonempty(shared_link_type_flag)) {
    this->LinkTypeEnabled = true;
    this->StaticLinkTypeFlag = *static_link_type_flag;
    this->SharedLinkTypeFlag = *shared_link_type_flag;
  }

  // Lookup the starting link type from the target (linked statically?).
  cmValue lss = this->Target->GetProperty("LINK_SEARCH_START_STATIC");
  this->StartLinkType = lss.IsOn() ? LinkStatic : LinkShared;
  this->CurrentLinkType = this->StartLinkType;
}